

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::RandomNormalDynamicLayerParams::ByteSizeLong
          (RandomNormalDynamicLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->seed_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->seed_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3;
  if (this->mean_ != 0.0) {
    sVar4 = sVar3 + 5;
  }
  if (NAN(this->mean_)) {
    sVar4 = sVar3 + 5;
  }
  sVar3 = sVar4;
  if (this->stddev_ != 0.0) {
    sVar3 = sVar4 + 5;
  }
  if (NAN(this->stddev_)) {
    sVar3 = sVar4 + 5;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 RandomNormalDynamicLayerParams::seed() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.RandomNormalDynamicLayerParams.seed)
  return seed_;
}